

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O3

bool __thiscall string_view::operator==(string_view *this,string_view *other)

{
  int iVar1;
  bool bVar2;
  string this_str;
  string other_str;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)this->_str);
  std::__cxx11::string::substr((ulong)&local_30,(ulong)other->_str);
  if (local_48 == local_28) {
    if (local_48 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_50,local_30,local_48);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return bVar2;
}

Assistant:

bool operator==(const string_view & other) const {
        std::string this_str = *this;
        std::string other_str = other;
        return this_str == other_str;
    }